

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall
ValidationSignals::ChainStateFlushed
          (ValidationSignals *this,ChainstateRole role,CBlockLocator *locator)

{
  pointer this_00;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  Logger *this_01;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  char *local_name;
  anon_class_40_3_58e176f4_for_event event;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  ChainstateRole local_60;
  vector<uint256,_std::allocator<uint256>_> local_58;
  ValidationSignals *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  event.role = role;
  std::vector<uint256,_std::allocator<uint256>_>::vector(&event.locator.vHave,&locator->vHave);
  local_name = "ChainStateFlushed";
  event.this = this;
  this_01 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_01,VALIDATION,Debug);
  if (bVar2) {
    this_00 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (this_00 ==
        (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_80._0_8_ = &local_70;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"null","");
    }
    else {
      base_blob<256u>::ToString_abi_cxx11_((string *)local_80,this_00);
    }
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    logging_function._M_str = "ChainStateFlushed";
    logging_function._M_len = 0x11;
    LogPrintFormatInternal<char_const*,std::__cxx11::string>
              (logging_function,source_file,0xf6,VALIDATION,Debug,
               (ConstevalFormatString<2U>)0xfb6b7b,&local_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._0_8_ != &local_70) {
      operator_delete((void *)local_80._0_8_,local_70._M_allocated_capacity + 1);
    }
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_80._0_8_ = local_name;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)(local_80 + 8),&locator->vHave);
  local_60 = event.role;
  std::vector<uint256,_std::allocator<uint256>_>::vector(&local_58,&event.locator.vHave);
  local_40 = event.this;
  local_d8 = (undefined8 *)0x0;
  uStack_d0 = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  puVar3 = (undefined8 *)operator_new(0x48);
  *puVar3 = local_80._0_8_;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)(puVar3 + 1),
             (vector<uint256,_std::allocator<uint256>_> *)(local_80 + 8));
  *(ChainstateRole *)(puVar3 + 4) = local_60;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)(puVar3 + 5),&local_58);
  puVar3[8] = local_40;
  pcStack_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:245:5)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:245:5)>
             ::_M_manager;
  local_d8 = puVar3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  if (local_58.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((void *)local_80._8_8_ != (void *)0x0) {
    operator_delete((void *)local_80._8_8_,local_70._8_8_ - local_80._8_8_);
  }
  if (event.locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(event.locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)event.locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)event.locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::ChainStateFlushed(ChainstateRole role, const CBlockLocator &locator) {
    auto event = [role, locator, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.ChainStateFlushed(role, locator); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s", __func__,
                          locator.IsNull() ? "null" : locator.vHave.front().ToString());
}